

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O0

longdouble *
chaiscript::boxed_cast<long_double>
          (longdouble *__return_storage_ptr__,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Type_Info *pTVar2;
  Type_Conversions *pTVar3;
  longdouble *plVar4;
  Conversion_Saves *from;
  longdouble *extraout_RAX;
  bad_boxed_cast *this;
  Type_Conversions_State *extraout_RDX;
  Type_Conversions_State *extraout_RDX_00;
  Boxed_Value BVar5;
  byte local_d1;
  byte local_c1;
  bad_any_cast *anon_var_0_1;
  undefined1 local_68 [24];
  bad_any_cast *anon_var_0;
  Type_Info local_40;
  Type_Conversions_State *local_28;
  Type_Conversions_State *t_conversions_local;
  Boxed_Value *bv_local;
  
  local_c1 = 1;
  local_28 = (Type_Conversions_State *)bv;
  t_conversions_local = (Type_Conversions_State *)__return_storage_ptr__;
  if (bv != (Boxed_Value *)0x0) {
    pTVar2 = Boxed_Value::get_type_info((Boxed_Value *)__return_storage_ptr__);
    user_type<long_double>();
    bVar1 = Type_Info::bare_equal(pTVar2,&local_40);
    local_c1 = 1;
    t_conversions = extraout_RDX;
    if (!bVar1) {
      local_d1 = 0;
      if (local_28 != (Type_Conversions_State *)0x0) {
        pTVar3 = Type_Conversions_State::operator->(local_28);
        bVar1 = Type_Conversions::convertable_type<long_double>(pTVar3);
        local_d1 = bVar1 ^ 0xff;
        t_conversions = extraout_RDX_00;
      }
      local_c1 = local_d1;
    }
  }
  if ((local_c1 & 1) == 0) {
    if (local_28 != (Type_Conversions_State *)0x0) {
      pTVar3 = Type_Conversions_State::operator->(local_28);
      bVar1 = Type_Conversions::convertable_type<long_double>(pTVar3);
      if (bVar1) {
        pTVar3 = Type_Conversions_State::operator->(local_28);
        from = Type_Conversions_State::saves(local_28);
        BVar5 = Type_Conversions::boxed_type_conversion<long_double>
                          ((Type_Conversions *)local_68,(Conversion_Saves *)pTVar3,
                           (Boxed_Value *)from);
        detail::Cast_Helper<long_double>::cast
                  ((longdouble *)local_68,(Boxed_Value *)local_28,
                   (Type_Conversions_State *)
                   BVar5.m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        Boxed_Value::~Boxed_Value((Boxed_Value *)local_68);
        return extraout_RAX;
      }
    }
    this = (bad_boxed_cast *)__cxa_allocate_exception(0x38);
    pTVar2 = Boxed_Value::get_type_info((Boxed_Value *)t_conversions_local);
    exception::bad_boxed_cast::bad_boxed_cast(this,*pTVar2,(type_info *)&long_double::typeinfo);
    __cxa_throw(this,&exception::bad_boxed_cast::typeinfo,exception::bad_boxed_cast::~bad_boxed_cast
               );
  }
  plVar4 = detail::Cast_Helper<long_double>::cast
                     ((longdouble *)t_conversions_local,(Boxed_Value *)local_28,t_conversions);
  return plVar4;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }